

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

type __thiscall
chrono::ChFunctorArchiveInSpecific<chrono::ChQuaternion<double>>::
_archive_in<chrono::ChQuaternion<double>>
          (ChFunctorArchiveInSpecific<chrono::ChQuaternion<double>> *this,ChArchiveIn *marchive)

{
  ChQuaternion<double>::ArchiveIN(*(ChQuaternion<double> **)(this + 8),marchive);
  return;
}

Assistant:

typename enable_if< ChDetect_ArchiveIN<Tc>::value, void >::type
        _archive_in(ChArchiveIn& marchive) {
            this->pt2Object->ArchiveIN(marchive);
        }